

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istream.cc
# Opt level: O0

Offset __thiscall
wabt::interp::Istream::Trace(Istream *this,Stream *stream,Offset offset,TraceSource *source)

{
  Opcode OVar1;
  Stream *pSVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  undefined8 uVar7;
  char *pcVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  InstrKind IVar13;
  InstrKind IVar14;
  string local_638 [48];
  u64 local_608;
  string local_600 [48];
  u64 local_5d0;
  string local_5c8 [48];
  u64 local_598;
  string local_590 [48];
  u64 local_560;
  string local_558 [48];
  u64 local_528;
  string local_520 [48];
  u64 local_4f0;
  string local_4e8 [48];
  u64 local_4b8;
  string local_4b0 [48];
  u64 local_480;
  string local_478 [48];
  u64 local_448;
  string local_440 [48];
  u64 local_410;
  string local_408 [48];
  u64 local_3d8;
  string local_3d0 [48];
  u64 local_3a0;
  string local_398 [48];
  u64 local_368;
  string local_360 [48];
  u64 local_330;
  string local_328 [48];
  u64 local_2f8;
  string local_2f0 [48];
  u64 local_2c0;
  string local_2b8 [48];
  u64 local_288;
  string local_280 [48];
  u64 local_250;
  string local_248 [48];
  u64 local_218;
  string local_210 [48];
  u64 local_1e0;
  string local_1d8 [48];
  u64 local_1a8;
  string local_1a0 [48];
  u64 local_170;
  string local_168 [48];
  u64 local_138;
  string local_130 [48];
  u64 local_100;
  string local_f8 [48];
  u64 local_c8;
  string local_c0 [48];
  u64 local_90;
  string local_88 [32];
  string local_68 [32];
  undefined1 local_48 [8];
  Instr instr;
  Offset start;
  TraceSource *source_local;
  Stream *pSStack_18;
  Offset offset_local;
  Stream *stream_local;
  Istream *this_local;
  
  instr.field_2._12_4_ = offset;
  source_local._4_4_ = offset;
  pSStack_18 = stream;
  stream_local = (Stream *)this;
  Read((Instr *)local_48,this,(Offset *)((long)&source_local + 4));
  pSVar2 = pSStack_18;
  (*source->_vptr_TraceSource[2])(local_68,source,(ulong)(uint)instr.field_2._12_4_);
  uVar7 = std::__cxx11::string::c_str();
  pcVar8 = Opcode::GetName((Opcode *)local_48);
  Stream::Writef(pSVar2,"%s| %s",uVar7,pcVar8);
  std::__cxx11::string::~string(local_68);
  pSVar2 = pSStack_18;
  IVar13 = instr.kind;
  OVar1 = instr.op;
  switch(local_48._4_4_) {
  case 0:
    Stream::Writef(pSStack_18,"\n");
    break;
  case 1:
    local_90 = instr.field_2.imm_u64;
    (*source->_vptr_TraceSource[3])(local_88,source,1);
    uVar7 = std::__cxx11::string::c_str();
    Stream::Writef(pSVar2," %s\n",uVar7);
    std::__cxx11::string::~string(local_88);
    break;
  case 2:
    local_c8 = instr.field_2.imm_u64;
    (*source->_vptr_TraceSource[3])(local_c0,source,2);
    uVar7 = std::__cxx11::string::c_str();
    local_100 = instr.field_2.imm_u64;
    (*source->_vptr_TraceSource[3])(local_f8,source,1);
    uVar12 = std::__cxx11::string::c_str();
    Stream::Writef(pSVar2," %s, %s\n",uVar7,uVar12);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string(local_c0);
    break;
  case 3:
    local_138 = instr.field_2.imm_u64;
    (*source->_vptr_TraceSource[3])(local_130,source,3);
    uVar7 = std::__cxx11::string::c_str();
    local_170 = instr.field_2.imm_u64;
    (*source->_vptr_TraceSource[3])(local_168,source,2);
    uVar12 = std::__cxx11::string::c_str();
    local_1a8 = instr.field_2.imm_u64;
    (*source->_vptr_TraceSource[3])(local_1a0,source,1);
    uVar10 = std::__cxx11::string::c_str();
    Stream::Writef(pSVar2," %s, %s, %s\n",uVar7,uVar12,uVar10);
    std::__cxx11::string::~string(local_1a0);
    std::__cxx11::string::~string(local_168);
    std::__cxx11::string::~string(local_130);
    break;
  case 4:
    Stream::Writef(pSStack_18," @%u\n",(ulong)instr.op.enum_);
    break;
  case 5:
    local_1e0 = instr.field_2.imm_u64;
    (*source->_vptr_TraceSource[3])(local_1d8,source,1);
    uVar7 = std::__cxx11::string::c_str();
    Stream::Writef(pSVar2," @%u, %s\n",(ulong)instr.op.enum_,uVar7);
    std::__cxx11::string::~string(local_1d8);
    break;
  case 6:
    Stream::Writef(pSStack_18," $%u\n",(ulong)instr.op.enum_);
    break;
  case 7:
    local_218 = instr.field_2.imm_u64;
    (*source->_vptr_TraceSource[3])(local_210,source,1);
    uVar7 = std::__cxx11::string::c_str();
    Stream::Writef(pSVar2," $%u, %s\n",(ulong)instr.op.enum_,uVar7);
    std::__cxx11::string::~string(local_210);
    break;
  case 8:
    local_250 = instr.field_2.imm_u64;
    (*source->_vptr_TraceSource[3])(local_248,source,2);
    uVar7 = std::__cxx11::string::c_str();
    local_288 = instr.field_2.imm_u64;
    (*source->_vptr_TraceSource[3])(local_280,source,1);
    uVar12 = std::__cxx11::string::c_str();
    Stream::Writef(pSVar2," $%u, %s, %s\n",(ulong)instr.op.enum_,uVar7,uVar12);
    std::__cxx11::string::~string(local_280);
    std::__cxx11::string::~string(local_248);
    break;
  case 9:
    local_2c0 = instr.field_2.imm_u64;
    (*source->_vptr_TraceSource[3])(local_2b8,source,3);
    uVar10 = std::__cxx11::string::c_str();
    local_2f8 = instr.field_2.imm_u64;
    (*source->_vptr_TraceSource[3])(local_2f0,source,2);
    uVar11 = std::__cxx11::string::c_str();
    uVar7 = CONCAT44(local_48._4_4_,local_48._0_4_);
    uVar12 = CONCAT44(instr.kind,instr.op.enum_);
    local_330 = instr.field_2.imm_u64;
    (*source->_vptr_TraceSource[3])(local_328,source,1);
    uVar9 = std::__cxx11::string::c_str();
    Stream::Writef(pSVar2," $%u, %s, %s, %s\n",(ulong)OVar1.enum_,uVar10,uVar11,uVar9,uVar7,uVar12,
                   instr.field_2.imm_u64);
    std::__cxx11::string::~string(local_328);
    std::__cxx11::string::~string(local_2f0);
    std::__cxx11::string::~string(local_2b8);
    break;
  case 10:
    Stream::Writef(pSStack_18," $%u\n",(ulong)instr.op.enum_);
    break;
  case 0xb:
    local_368 = instr.field_2.imm_u64;
    (*source->_vptr_TraceSource[3])(local_360,source,3);
    uVar12 = std::__cxx11::string::c_str();
    local_3a0 = instr.field_2.imm_u64;
    (*source->_vptr_TraceSource[3])(local_398,source,2);
    uVar10 = std::__cxx11::string::c_str();
    uVar7 = CONCAT44(instr.kind,instr.op.enum_);
    local_3d8 = instr.field_2.imm_u64;
    (*source->_vptr_TraceSource[3])(local_3d0,source,1);
    uVar11 = std::__cxx11::string::c_str();
    Stream::Writef(pSVar2," $%u, $%u, %s, %s, %s\n",(ulong)OVar1.enum_,(ulong)IVar13,uVar12,uVar10,
                   uVar11,uVar7,instr.field_2.imm_u64);
    std::__cxx11::string::~string(local_3d0);
    std::__cxx11::string::~string(local_398);
    std::__cxx11::string::~string(local_360);
    break;
  case 0xc:
    Stream::Writef(pSStack_18," $%u, $%u\n",(ulong)instr.op.enum_,(ulong)instr.kind);
    break;
  case 0xd:
    local_410 = instr.field_2.imm_u64;
    (*source->_vptr_TraceSource[3])(local_408,source,1);
    uVar7 = std::__cxx11::string::c_str();
    Stream::Writef(pSVar2," $%u:%s+$%u\n",(ulong)instr.op.enum_,uVar7,(ulong)instr.kind);
    std::__cxx11::string::~string(local_408);
    break;
  case 0xe:
    local_448 = instr.field_2.imm_u64;
    (*source->_vptr_TraceSource[3])(local_440,source,2);
    uVar10 = std::__cxx11::string::c_str();
    uVar7 = CONCAT44(local_48._4_4_,local_48._0_4_);
    uVar12 = CONCAT44(instr.kind,instr.op.enum_);
    local_480 = instr.field_2.imm_u64;
    (*source->_vptr_TraceSource[3])(local_478,source,1);
    uVar11 = std::__cxx11::string::c_str();
    Stream::Writef(pSVar2," $%u:%s+$%u, %s\n",(ulong)OVar1.enum_,uVar10,(ulong)instr.kind,uVar11,
                   uVar7,uVar12,instr.field_2.imm_u64);
    std::__cxx11::string::~string(local_478);
    std::__cxx11::string::~string(local_440);
    break;
  case 0xf:
    local_4b8 = instr.field_2.imm_u64;
    (*source->_vptr_TraceSource[3])(local_4b0,source,3);
    uVar12 = std::__cxx11::string::c_str();
    IVar13 = instr.kind;
    local_4f0 = instr.field_2.imm_u64;
    (*source->_vptr_TraceSource[3])(local_4e8,source,2);
    uVar10 = std::__cxx11::string::c_str();
    uVar7 = CONCAT44(instr.kind,instr.op.enum_);
    local_528 = instr.field_2.imm_u64;
    (*source->_vptr_TraceSource[3])(local_520,source,1);
    uVar11 = std::__cxx11::string::c_str();
    Stream::Writef(pSVar2," $%u:%s+$%u, %s, %s\n",(ulong)OVar1.enum_,uVar12,(ulong)IVar13,uVar10,
                   uVar11,uVar7,instr.field_2.imm_u64);
    std::__cxx11::string::~string(local_520);
    std::__cxx11::string::~string(local_4e8);
    std::__cxx11::string::~string(local_4b0);
    break;
  case 0x10:
    Stream::Writef(pSStack_18," %u\n",(ulong)instr.op.enum_);
    break;
  case 0x11:
    Stream::Writef(pSStack_18," %lu\n",CONCAT44(instr.kind,instr.op.enum_));
    break;
  case 0x12:
    Stream::Writef(pSStack_18," %g\n",(double)(float)instr.op.enum_);
    break;
  case 0x13:
    Stream::Writef(pSStack_18," %g\n",CONCAT44(instr.kind,instr.op.enum_));
    break;
  case 0x14:
    Stream::Writef(pSStack_18," $%u $%u\n",(ulong)instr.op.enum_,(ulong)instr.kind);
    break;
  case 0x15:
    local_560 = instr.field_2.imm_u64;
    (*source->_vptr_TraceSource[3])(local_558,source,1);
    uVar7 = std::__cxx11::string::c_str();
    Stream::Writef(pSVar2," %s : (Lane imm: %u)\n",uVar7,(ulong)(byte)(undefined1)instr.op.enum_);
    std::__cxx11::string::~string(local_558);
    break;
  case 0x16:
    local_598 = instr.field_2.imm_u64;
    (*source->_vptr_TraceSource[3])(local_590,source,2);
    uVar7 = std::__cxx11::string::c_str();
    local_5d0 = instr.field_2.imm_u64;
    (*source->_vptr_TraceSource[3])(local_5c8,source,1);
    uVar12 = std::__cxx11::string::c_str();
    Stream::Writef(pSVar2," %s, %s : (Lane imm: $%u)\n",uVar7,uVar12,
                   (ulong)(byte)(undefined1)instr.op.enum_);
    std::__cxx11::string::~string(local_5c8);
    std::__cxx11::string::~string(local_590);
    break;
  case 0x17:
    uVar3 = v128::u32((v128 *)&instr,0);
    uVar4 = v128::u32((v128 *)&instr,1);
    uVar5 = v128::u32((v128 *)&instr,2);
    uVar6 = v128::u32((v128 *)&instr,3);
    Stream::Writef(pSVar2," i32x4 0x%08x 0x%08x 0x%08x 0x%08x\n",(ulong)uVar3,(ulong)uVar4,
                   (ulong)uVar5,(ulong)uVar6);
    break;
  case 0x18:
    local_608 = instr.field_2.imm_u64;
    (*source->_vptr_TraceSource[3])(local_600,source,2);
    uVar7 = std::__cxx11::string::c_str();
    IVar13 = local_48._4_4_;
    IVar14 = instr.kind;
    (*source->_vptr_TraceSource[3])(local_638,source,1);
    uVar12 = std::__cxx11::string::c_str();
    uVar3 = v128::u32((v128 *)&instr,0);
    uVar4 = v128::u32((v128 *)&instr,1);
    uVar5 = v128::u32((v128 *)&instr,2);
    uVar6 = v128::u32((v128 *)&instr,3);
    Stream::Writef(pSVar2," %s, %s : (Lane imm: i32x4 0x%08x 0x%08x 0x%08x 0x%08x )\n",uVar7,uVar12,
                   (ulong)uVar3,(ulong)uVar4,CONCAT44(IVar13,uVar5),CONCAT44(IVar14,uVar6));
    std::__cxx11::string::~string(local_638);
    std::__cxx11::string::~string(local_600);
  }
  return source_local._4_4_;
}

Assistant:

Istream::Offset Istream::Trace(Stream* stream,
                               Offset offset,
                               TraceSource* source) const {
  Offset start = offset;
  Instr instr = Read(&offset);
  stream->Writef("%s| %s", source->Header(start).c_str(), instr.op.GetName());

  switch (instr.kind) {
    case InstrKind::Imm_0_Op_0:
      stream->Writef("\n");
      break;

    case InstrKind::Imm_0_Op_1:
      stream->Writef(" %s\n", source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_0_Op_2:
      stream->Writef(" %s, %s\n", source->Pick(2, instr).c_str(),
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_0_Op_3:
      stream->Writef(" %s, %s, %s\n", source->Pick(3, instr).c_str(),
                     source->Pick(2, instr).c_str(),
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Jump_Op_0:
      stream->Writef(" @%u\n", instr.imm_u32);
      break;

    case InstrKind::Imm_Jump_Op_1:
      stream->Writef(" @%u, %s\n", instr.imm_u32,
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Index_Op_0:
      stream->Writef(" $%u\n", instr.imm_u32);
      break;

    case InstrKind::Imm_Index_Op_1:
      stream->Writef(" $%u, %s\n", instr.imm_u32,
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Index_Op_2:
      stream->Writef(" $%u, %s, %s\n", instr.imm_u32,
                     source->Pick(2, instr).c_str(),
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Index_Op_3:
      stream->Writef(
          " $%u, %s, %s, %s\n", instr.imm_u32, source->Pick(3, instr).c_str(),
          source->Pick(2, instr).c_str(), source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Index_Op_N:
      stream->Writef(" $%u\n", instr.imm_u32); // TODO param/result count?
      break;

    case InstrKind::Imm_Index_Index_Op_3:
      stream->Writef(" $%u, $%u, %s, %s, %s\n", instr.imm_u32x2.fst,
                     instr.imm_u32x2.snd, source->Pick(3, instr).c_str(),
                     source->Pick(2, instr).c_str(),
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Index_Index_Op_N:
      stream->Writef(" $%u, $%u\n", instr.imm_u32x2.fst,
                     instr.imm_u32x2.snd);  // TODO param/result count?
      break;

    case InstrKind::Imm_Index_Offset_Op_1:
      stream->Writef(" $%u:%s+$%u\n", instr.imm_u32x2.fst,
                     source->Pick(1, instr).c_str(), instr.imm_u32x2.snd);
      break;

    case InstrKind::Imm_Index_Offset_Op_2:
      stream->Writef(" $%u:%s+$%u, %s\n", instr.imm_u32x2.fst,
                     source->Pick(2, instr).c_str(), instr.imm_u32x2.snd,
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Index_Offset_Op_3:
      stream->Writef(" $%u:%s+$%u, %s, %s\n", instr.imm_u32x2.fst,
                     source->Pick(3, instr).c_str(), instr.imm_u32x2.snd,
                     source->Pick(2, instr).c_str(),
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_I32_Op_0:
      stream->Writef(" %u\n", instr.imm_u32);
      break;

    case InstrKind::Imm_I64_Op_0:
      stream->Writef(" %" PRIu64 "\n", instr.imm_u64);
      break;

    case InstrKind::Imm_F32_Op_0:
      stream->Writef(" %g\n", instr.imm_f32);
      break;

    case InstrKind::Imm_F64_Op_0:
      stream->Writef(" %g\n", instr.imm_f64);
      break;

    case InstrKind::Imm_I32_I32_Op_0:
      stream->Writef(" $%u $%u\n", instr.imm_u32x2.fst, instr.imm_u32x2.snd);
      break;

    case InstrKind::Imm_I8_Op_1:
      // TODO: cleanup
      stream->Writef(" %s : (Lane imm: %u)\n", source->Pick(1, instr).c_str(),
                     instr.imm_u8);
      break;

    case InstrKind::Imm_I8_Op_2:
      // TODO: cleanup
      stream->Writef(" %s, %s : (Lane imm: $%u)\n",
                     source->Pick(2, instr).c_str(),
                     source->Pick(1, instr).c_str(), instr.imm_u8);
      break;

    case InstrKind::Imm_V128_Op_0:
      stream->Writef(" i32x4 0x%08x 0x%08x 0x%08x 0x%08x\n",
                     instr.imm_v128.u32(0), instr.imm_v128.u32(1),
                     instr.imm_v128.u32(2), instr.imm_v128.u32(3));
      break;

    case InstrKind::Imm_V128_Op_2:
      // TODO: cleanup
      stream->Writef(
          " %s, %s : (Lane imm: i32x4 0x%08x 0x%08x 0x%08x 0x%08x )\n",
          source->Pick(2, instr).c_str(), source->Pick(1, instr).c_str(),
          instr.imm_v128.u32(0), instr.imm_v128.u32(1), instr.imm_v128.u32(2),
          instr.imm_v128.u32(3));
      break;
  }
  return offset;
}